

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void random_fill<eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
               (ordered_collection<container,_A,_B,_C,_D,_CA,_CB> *container,
               mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *gen,uniform_int_distribution<int> *rnd_type,uniform_real_distribution<double> *rnd,
               size_t count)

{
  result_type rVar1;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  double dVar2;
  CB local_90;
  
  if (count != 0) {
    do {
      rVar1 = std::uniform_int_distribution<int>::operator()(rnd_type,gen,&rnd_type->_M_param);
      switch(rVar1) {
      case 0:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128eb0;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<A>
                  (container,(A *)&local_90);
        break;
      case 1:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128ee8;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<B>
                  (container,(B *)&local_90);
        break;
      case 2:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128f28;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<C>
                  (container,(C *)&local_90);
        break;
      case 3:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128f68;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<D>
                  (container,(D *)&local_90);
        break;
      case 4:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128fa8;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<CA>
                  (container,&local_90.super_CA);
        break;
      case 5:
        dVar2 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                          (gen);
        local_90.super_CA.super_C.super_B.super_A.data = (rnd->_M_param)._M_a;
        local_90.super_CA.super_C.super_B.super_A.data =
             ((rnd->_M_param)._M_b - local_90.super_CA.super_C.super_B.super_A.data) * dVar2 +
             local_90.super_CA.super_C.super_B.super_A.data;
        local_90.super_CA.super_C.super_B.super_A._vptr_A = (_func_int **)&PTR__A_00128fe8;
        eumorphic::ordered_collection<container,_A,_B,_C,_D,_CA,_CB>::insert<CB>
                  (container,&local_90);
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void random_fill(Cont&container, E& gen, R1& rnd_type, R2& rnd, std::size_t count )
{
	for ( std::size_t i = 0; i != count; i++)
        {
            switch (rnd_type(gen))
		{
                        case 0: insert_rnd_value_of<A> (container, gen, rnd); break;
                        case 1: insert_rnd_value_of<B> (container, gen, rnd); break;
                        case 2: insert_rnd_value_of<C> (container, gen, rnd); break;
                        case 3: insert_rnd_value_of<D> (container, gen, rnd); break;
			case 4: insert_rnd_value_of<CA>(container, gen, rnd); break;
			case 5: insert_rnd_value_of<CB>(container, gen, rnd); break;
		}
	}
}